

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::debug_log(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
            *this,char *msg,RBPath *path,ChildRef base)

{
  RBPath *path_local;
  char *msg_local;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *this_local;
  ChildRef base_local;
  
  return;
}

Assistant:

void debug_log(const char* msg, RBPath& path, ChildRef base)
    {
      if constexpr (TRACE)
      {
        message<100>("------- {}", Rep::name());
        message<1024>(msg);
        path.print();
        print(base);
      }
      else
      {
        UNUSED(msg, path, base);
      }
    }